

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

CURLcode Curl_build_unencoding_stack(connectdata *conn,char *enclist,int maybechunked)

{
  byte *pbVar1;
  byte bVar2;
  Curl_easy *pCVar3;
  int iVar4;
  contenc_writer *pcVar5;
  size_t max;
  byte *pbVar6;
  content_encoding **cep;
  size_t sVar7;
  content_encoding **ppcVar8;
  content_encoding *handler;
  
  pCVar3 = conn->data;
  do {
    while( true ) {
      sVar7 = 1;
      iVar4 = Curl_isspace((uint)(byte)*enclist);
      if ((iVar4 == 0) && (bVar2 = *enclist, bVar2 != 0x2c)) break;
      enclist = (char *)((byte *)enclist + 1);
    }
    max = 0;
    pbVar6 = (byte *)enclist;
    while ((bVar2 != 0 && (bVar2 != 0x2c))) {
      iVar4 = Curl_isspace((uint)bVar2);
      if (iVar4 == 0) {
        max = sVar7;
      }
      pbVar1 = pbVar6 + 1;
      pbVar6 = pbVar6 + 1;
      sVar7 = sVar7 + 1;
      bVar2 = *pbVar1;
    }
    if ((maybechunked == 0) || (max != 7)) {
      if (max != 0) goto LAB_0012ac13;
    }
    else {
      iVar4 = Curl_strncasecompare(enclist,"chunked",7);
      if (iVar4 == 0) {
LAB_0012ac13:
        for (ppcVar8 = encodings; handler = *ppcVar8, handler != (content_encoding *)0x0;
            ppcVar8 = ppcVar8 + 1) {
          iVar4 = Curl_strncasecompare(enclist,handler->name,max);
          if (((iVar4 != 0) && (handler->name[max] == '\0')) ||
             ((handler->alias != (char *)0x0 &&
              ((iVar4 = Curl_strncasecompare(enclist,handler->alias,max), iVar4 != 0 &&
               (handler->alias[max] == '\0')))))) goto LAB_0012ac6f;
        }
        handler = &error_encoding;
LAB_0012ac6f:
        pcVar5 = (pCVar3->req).writer_stack;
        if (pcVar5 == (contenc_writer *)0x0) {
          pcVar5 = new_unencoding_writer(conn,&client_encoding,(contenc_writer *)0x0);
          (pCVar3->req).writer_stack = pcVar5;
          if (pcVar5 == (contenc_writer *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        pcVar5 = new_unencoding_writer(conn,handler,pcVar5);
        if (pcVar5 == (contenc_writer *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (pCVar3->req).writer_stack = pcVar5;
      }
      else {
        (pCVar3->req).chunk = true;
        Curl_httpchunk_init(conn);
      }
    }
    enclist = (char *)pbVar6;
    if (*pbVar6 == 0) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct connectdata *conn,
                                     const char *enclist, int maybechunked)
{
  struct Curl_easy *data = conn->data;
  struct SingleRequest *k = &data->req;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISSPACE(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    /* Special case: chunked encoding is handled at the reader level. */
    if(maybechunked && namelen == 7 && strncasecompare(name, "chunked", 7)) {
      k->chunk = TRUE;             /* chunks coming our way. */
      Curl_httpchunk_init(conn);   /* init our chunky engine. */
    }
    else if(namelen) {
      const content_encoding *encoding = find_encoding(name, namelen);
      contenc_writer *writer;

      if(!k->writer_stack) {
        k->writer_stack = new_unencoding_writer(conn, &client_encoding, NULL);

        if(!k->writer_stack)
          return CURLE_OUT_OF_MEMORY;
      }

      if(!encoding)
        encoding = &error_encoding;  /* Defer error at stack use. */

      /* Stack the unencoding stage. */
      writer = new_unencoding_writer(conn, encoding, k->writer_stack);
      if(!writer)
        return CURLE_OUT_OF_MEMORY;
      k->writer_stack = writer;
    }
  } while(*enclist);

  return CURLE_OK;
}